

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
pbrt::RGBFilm::AddSplat(RGBFilm *this,Point2f *p,SampledSpectrum L,SampledWavelengths *lambda)

{
  AtomicDouble *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Pixel *pPVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  short sVar12;
  float *__result;
  Tuple2<pbrt::Point2,_float> *pTVar13;
  double dVar14;
  double dVar15;
  long lVar16;
  anon_class_8_1_54a39810 eval;
  GaussianFilter *this_00;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 unaff_R13;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [56];
  undefined1 auVar27 [64];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  RGB RVar41;
  Tuple2<pbrt::Point2,_float> local_a8;
  float local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  SampledSpectrum local_58;
  undefined1 local_48 [16];
  
  auVar27._8_56_ = L._16_56_;
  auVar27._0_8_ = L.values.values._8_8_;
  auVar40._8_56_ = L._8_56_;
  auVar40._0_8_ = L.values.values._0_8_;
  pTVar13 = &local_a8;
  local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar40._0_16_,auVar27._0_16_);
  if (!NAN(local_58.values.values[0])) {
    uVar18 = 0;
    do {
      uVar20 = uVar18;
      if (uVar20 == 3) break;
      fVar25 = local_58.values.values[uVar20 + 1];
      uVar18 = uVar20 + 1;
    } while (!NAN(fVar25) && !NAN(fVar25));
    auVar26 = (undefined1  [56])0x0;
    if (2 < uVar20) {
      RVar41 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&local_58,lambda);
      local_a0 = RVar41.b;
      auVar36._0_8_ = RVar41._0_8_;
      auVar36._8_56_ = auVar26;
      local_68 = auVar36._0_16_;
      local_a8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_68);
      lVar16 = 4;
      do {
        if (pTVar13->x < *(float *)((long)&local_a8.x + lVar16)) {
          pTVar13 = (Tuple2<pbrt::Point2,_float> *)((long)&local_a8.x + lVar16);
        }
        lVar16 = lVar16 + 4;
      } while (lVar16 != 0xc);
      fVar25 = pTVar13->x;
      fVar29 = this->maxComponentValue;
      fVar28 = fVar29 / fVar25;
      if (fVar29 < fVar25) {
        local_68._0_4_ = RVar41.r * fVar28;
        local_68._4_4_ = RVar41.g * fVar28;
        local_68._8_4_ = auVar26._0_4_ * fVar28;
        local_68._12_4_ = auVar26._4_4_ * fVar28;
      }
      auVar40 = ZEXT1664(local_68);
      uVar18 = *(ulong *)((this->super_FilmBase).filter.
                          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                          .bits & 0xffffffffffff);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar18;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar22._8_4_ = 0x3f000000;
      auVar22._0_8_ = 0x3f0000003f000000;
      auVar22._12_4_ = 0x3f000000;
      auVar22 = vaddps_avx512vl(auVar24,auVar22);
      auVar24 = vsubps_avx(auVar22,auVar23);
      auVar32._0_4_ = auVar22._0_4_ + (float)uVar18;
      auVar32._4_4_ = auVar22._4_4_ + (float)(uVar18 >> 0x20);
      auVar32._8_4_ = auVar22._8_4_ + 0.0;
      auVar32._12_4_ = auVar22._12_4_ + 0.0;
      auVar22 = vroundps_avx(auVar32,9);
      auVar23 = vroundps_avx(auVar24,9);
      auVar34._0_4_ = (int)auVar23._0_4_;
      auVar34._4_4_ = (int)auVar23._4_4_;
      auVar34._8_4_ = (int)auVar23._8_4_;
      auVar34._12_4_ = (int)auVar23._12_4_;
      auVar33._0_4_ = (int)auVar22._0_4_;
      auVar33._4_4_ = (int)auVar22._4_4_;
      auVar33._8_4_ = (int)auVar22._8_4_;
      auVar33._12_4_ = (int)auVar22._12_4_;
      auVar22 = vpcmpeqd_avx(auVar24,auVar24);
      auVar23 = vpsubd_avx(auVar33,auVar22);
      auVar22 = vpminsd_avx(auVar23,auVar34);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>;
      local_48 = vpmaxsd_avx(auVar22,auVar37);
      uVar17 = local_48._4_4_;
      auVar22 = vpmaxsd_avx(auVar34,auVar23);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar22 = vpminsd_avx(auVar35,auVar22);
      uVar11 = auVar22._4_4_;
      if ((int)auVar22._4_4_ < (int)uVar17) {
        uVar11 = uVar17;
      }
      uVar18 = vpcmpd_avx512vl(local_48,auVar22,5);
      if ((uVar18 & 3) == 0) {
        uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar29),ZEXT416((uint)fVar25),1);
        bVar21 = (bool)((byte)uVar6 & 1);
        local_78._4_12_ = auVar27._4_12_;
        local_78._0_4_ = (uint)bVar21 * (int)(local_a0 * fVar28) + (uint)!bVar21 * (int)local_a0;
        auVar27 = ZEXT1664(local_78);
        uVar20 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),local_48._0_4_);
        uVar18 = (ulong)uVar17 << 0x20 | uVar20;
        local_88 = vmovshdup_avx(local_68);
        auVar36 = ZEXT1664(local_88);
        auVar39 = ZEXT1664(local_48);
        do {
          local_98 = auVar39._0_16_;
          auVar23 = vcvtdq2ps_avx(local_98);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
          auVar23 = vsubps_avx(auVar30,auVar23);
          auVar7._8_4_ = 0xbf000000;
          auVar7._0_8_ = 0xbf000000bf000000;
          auVar7._12_4_ = 0xbf000000;
          auVar23 = vaddps_avx512vl(auVar23,auVar7);
          local_a8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar23);
          uVar19 = (this->super_FilmBase).filter.
                   super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                   .bits;
          this_00 = (GaussianFilter *)(uVar19 & 0xffffffffffff);
          sVar12 = (short)(uVar19 >> 0x30);
          if (uVar19 >> 0x30 < 3) {
            if (sVar12 == 2) {
              fVar25 = GaussianFilter::Evaluate(this_00,(Point2f *)&local_a8);
              goto LAB_00331a60;
            }
            auVar8._8_4_ = 0x7fffffff;
            auVar8._0_8_ = 0x7fffffff7fffffff;
            auVar8._12_4_ = 0x7fffffff;
            auVar24 = vandps_avx512vl(auVar23,auVar8);
            fVar25 = 0.0;
            if (auVar24._0_4_ <= (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
              auVar23 = vmovshdup_avx(auVar23);
              auVar9._8_4_ = 0x7fffffff;
              auVar9._0_8_ = 0x7fffffff7fffffff;
              auVar9._12_4_ = 0x7fffffff;
              auVar23 = vandps_avx512vl(auVar23,auVar9);
              uVar6 = vcmpss_avx512f(auVar23,ZEXT416((uint)(this_00->radius).
                                                           super_Tuple2<pbrt::Vector2,_float>.y),2);
              fVar25 = (float)((uint)((byte)uVar6 & 1) * 0x3f800000);
            }
          }
          else {
            if (uVar19 >> 0x30 == 4) {
              fVar25 = LanczosSincFilter::Evaluate
                                 ((LanczosSincFilter *)this_00,(Point2f *)&local_a8);
            }
            else {
              if (sVar12 != 3) {
                auVar10._8_4_ = 0x7fffffff;
                auVar10._0_8_ = 0x7fffffff7fffffff;
                auVar10._12_4_ = 0x7fffffff;
                auVar23 = vandps_avx512vl(auVar23,auVar10);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>;
                auVar23 = vsubps_avx(auVar31,auVar23);
                auVar23 = vmaxps_avx(auVar23,_DAT_00453010);
                auVar24 = vmovshdup_avx(auVar23);
                fVar25 = auVar23._0_4_ * auVar24._0_4_;
                goto LAB_00331a9c;
              }
              fVar25 = MitchellFilter::Evaluate((MitchellFilter *)this_00,(Point2f *)&local_a8);
            }
LAB_00331a60:
            auVar39 = ZEXT1664(local_98);
            auVar36 = ZEXT1664(local_88);
            auVar27 = ZEXT1664(local_78);
            auVar40 = ZEXT1664(local_68);
          }
LAB_00331a9c:
          if ((fVar25 != 0.0) || (NAN(fVar25))) {
            iVar2 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
            iVar3 = (this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
            iVar4 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
            pPVar5 = (this->pixels).values;
            lVar16 = 0;
            do {
              fVar29 = auVar40._0_4_;
              if (((int)lVar16 != 0) && (fVar29 = auVar36._0_4_, (int)lVar16 != 1)) {
                fVar29 = auVar27._0_4_;
              }
              pAVar1 = pPVar5[(iVar3 - iVar2) * ((int)(uVar18 >> 0x20) - iVar4) +
                              ((int)uVar18 - iVar2)].splatRGB + lVar16;
              dVar14 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
              do {
                LOCK();
                dVar15 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                bVar21 = dVar14 == dVar15;
                if (bVar21) {
                  (pAVar1->bits).super___atomic_base<unsigned_long>._M_i =
                       (__int_type)((double)(fVar25 * fVar29) + dVar14);
                  dVar15 = dVar14;
                }
                UNLOCK();
                dVar14 = dVar15;
              } while (!bVar21);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
          }
          uVar17 = auVar39._0_4_ + 1;
          uVar19 = uVar18 & 0xffffffff00000000;
          uVar18 = uVar19 + uVar20 + 0x100000000;
          if (uVar17 != auVar22._0_4_) {
            uVar18 = uVar19 | uVar17;
          }
          auVar39 = ZEXT864(uVar18);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar18;
          uVar19 = vpcmpd_avx512vl(auVar38,local_48,4);
        } while (((uVar19 & 1) != 0) || (uVar11 != (uint)(uVar18 >> 0x20)));
      }
      return;
    }
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/film.cpp"
             ,0x1e0,"Check failed: %s",(char (*) [13])"!L.HasNaNs()");
}

Assistant:

void RGBFilm::AddSplat(const Point2f &p, SampledSpectrum L,
                       const SampledWavelengths &lambda) {
    CHECK(!L.HasNaNs());
    // Convert sample radiance to _PixelSensor_ RGB
    RGB rgb = sensor->ToSensorRGB(L, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue) {
        rgb *= maxComponentValue / m;
    }

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}